

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_metadata.cc
# Opt level: O0

void __thiscall
draco::GeometryMetadata::GeometryMetadata(GeometryMetadata *this,GeometryMetadata *metadata)

{
  ulong uVar1;
  size_type sVar2;
  _Base_ptr in_RSI;
  Metadata *in_stack_00000008;
  Metadata *in_stack_00000010;
  size_t i;
  pointer in_stack_ffffffffffffff98;
  type in_stack_ffffffffffffffa0;
  ulong local_18;
  _Base_ptr local_10;
  
  local_10 = in_RSI;
  Metadata::Metadata(in_stack_00000010,in_stack_00000008);
  std::
  vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  ::vector((vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
            *)0x1be635);
  local_18 = 0;
  while( true ) {
    uVar1 = local_18;
    sVar2 = std::
            vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
            ::size((vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
                    *)(local_10 + 3));
    if (sVar2 <= uVar1) break;
    operator_new(0x68);
    std::
    vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
    ::operator[]((vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
                  *)(local_10 + 3),local_18);
    in_stack_ffffffffffffffa0 =
         std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
         operator*((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                    *)in_stack_ffffffffffffffa0);
    AttributeMetadata::AttributeMetadata(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff98 = (pointer)&stack0xffffffffffffffe0;
    std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>::
    unique_ptr<std::default_delete<draco::AttributeMetadata>,void>
              ((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::
    vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
    ::push_back((vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
                 *)in_stack_ffffffffffffffa0,(value_type *)in_stack_ffffffffffffff98);
    std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
    ~unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                 *)in_stack_ffffffffffffffa0);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

GeometryMetadata::GeometryMetadata(const GeometryMetadata &metadata)
    : Metadata(metadata) {
  for (size_t i = 0; i < metadata.att_metadatas_.size(); ++i) {
    att_metadatas_.push_back(std::unique_ptr<AttributeMetadata>(
        new AttributeMetadata(*metadata.att_metadatas_[i])));
  }
}